

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.h
# Opt level: O2

void __thiscall fasttext::ProductQuantizer::ProductQuantizer(ProductQuantizer *this)

{
  this->nbits_ = 8;
  this->ksub_ = 0x100;
  this->max_points_per_cluster_ = 0x100;
  this->max_points_ = 0x10000;
  this->seed_ = 0x4d2;
  this->niter_ = 0x19;
  this->eps_ = 1e-07;
  (this->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
  (this->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  (this->rng)._M_x = 1;
  return;
}

Assistant:

ProductQuantizer() {}